

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O2

void btSoftBody::solveClusters(btAlignedObjectArray<btSoftBody_*> *bodies)

{
  ulong uVar1;
  int iterations;
  int j;
  ulong uVar2;
  int iVar3;
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)bodies->m_size;
  if (bodies->m_size < 1) {
    uVar2 = uVar1;
  }
  iterations = 0;
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    iVar3 = (bodies->m_data[uVar1]->m_cfg).citerations;
    if (iterations <= iVar3) {
      iterations = iVar3;
    }
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    prepareClusters(bodies->m_data[uVar1],iterations);
  }
  iVar3 = 0;
  if (iterations < 1) {
    iterations = iVar3;
  }
  for (; iVar3 != iterations; iVar3 = iVar3 + 1) {
    for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
      solveClusters(bodies->m_data[uVar1],1.0);
    }
  }
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    cleanupClusters(bodies->m_data[uVar1]);
  }
  return;
}

Assistant:

void			btSoftBody::solveClusters(const btAlignedObjectArray<btSoftBody*>& bodies)
{
	const int	nb=bodies.size();
	int			iterations=0;
	int i;

	for(i=0;i<nb;++i)
	{
		iterations=btMax(iterations,bodies[i]->m_cfg.citerations);
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->prepareClusters(iterations);
	}
	for(i=0;i<iterations;++i)
	{
		const btScalar sor=1;
		for(int j=0;j<nb;++j)
		{
			bodies[j]->solveClusters(sor);
		}
	}
	for(i=0;i<nb;++i)
	{
		bodies[i]->cleanupClusters();
	}
}